

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::DitheringTests::init(DitheringTests *this,EVP_PKEY_CTX *ctx)

{
  DitheringTests *pDVar1;
  TestCaseGroup *this_00;
  char *pcVar2;
  DitheringCase *this_01;
  TestContext *testCtx;
  RenderContext *renderCtx;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string caseName;
  int local_38;
  PatternType patternType;
  int caseColorNdx;
  int patternTypeI;
  TestCaseGroup *group;
  uint local_20;
  bool ditheringEnabled;
  int ditheringEnabledI;
  DitheringTests *this_local;
  
  pDVar1 = this;
  if (init()::caseColors == '\0') {
    pDVar1 = (DitheringTests *)__cxa_guard_acquire(&init()::caseColors);
    if ((int)pDVar1 != 0) {
      init::caseColors[0].name = "white";
      tcu::Vector<float,_4>::Vector(&init::caseColors[0].color,1.0,1.0,1.0,1.0);
      init::caseColors[1].name = "red";
      tcu::Vector<float,_4>::Vector(&init::caseColors[1].color,1.0,0.0,0.0,1.0);
      init::caseColors[2].name = "green";
      tcu::Vector<float,_4>::Vector(&init::caseColors[2].color,0.0,1.0,0.0,1.0);
      init::caseColors[3].name = "blue";
      tcu::Vector<float,_4>::Vector(&init::caseColors[3].color,0.0,0.0,1.0,1.0);
      init::caseColors[4].name = "alpha";
      tcu::Vector<float,_4>::Vector(&init::caseColors[4].color,0.0,0.0,0.0,1.0);
      pDVar1 = (DitheringTests *)__cxa_guard_release(&init()::caseColors);
    }
  }
  local_20 = 0;
  while ((int)local_20 < 2) {
    this_00 = (TestCaseGroup *)operator_new(0x78);
    pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
    if (local_20 != 0) {
      pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
    }
    TestCaseGroup::TestCaseGroup(this_00,(this->super_TestCaseGroup).m_context,pcVar2 + 0x27,"");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    for (patternType = PATTERNTYPE_GRADIENT; (int)patternType < 2;
        patternType = patternType + PATTERNTYPE_UNICOLORED_QUAD) {
      for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
        caseName.field_2._12_4_ = patternType;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
        pcVar2 = DitheringCase::getPatternTypeName(caseName.field_2._12_4_);
        std::operator+(&local_a0,&local_c0,pcVar2);
        std::operator+(&local_80,&local_a0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,&local_80,init::caseColors[local_38].name);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        this_01 = (DitheringCase *)operator_new(0xb0);
        testCtx = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
        renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        DitheringCase::DitheringCase
                  (this_01,testCtx,renderCtx,pcVar2,"",local_20 != 0,caseName.field_2._12_4_,
                   &init::caseColors[local_38].color);
        tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)local_60);
      }
    }
    local_20 = local_20 + 1;
    pDVar1 = (DitheringTests *)(ulong)local_20;
  }
  return (int)pDVar1;
}

Assistant:

void DitheringTests::init (void)
{
	static const struct
	{
		const char*		name;
		Vec4			color;
	} caseColors[] =
	{
		{ "white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
		{ "red",		Vec4(1.0f, 0.0f, 0.0f, 1.0f) },
		{ "green",		Vec4(0.0f, 1.0f, 0.0f, 1.0f) },
		{ "blue",		Vec4(0.0f, 0.0f, 1.0f, 1.0f) },
		{ "alpha",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) }
	};

	for (int ditheringEnabledI = 0; ditheringEnabledI <= 1; ditheringEnabledI++)
	{
		const bool				ditheringEnabled	= ditheringEnabledI != 0;
		TestCaseGroup* const	group				= new TestCaseGroup(m_context, ditheringEnabled ? "enabled" : "disabled", "");
		addChild(group);

		for (int patternTypeI = 0; patternTypeI < DitheringCase::PATTERNTYPE_LAST; patternTypeI++)
		{
			for (int caseColorNdx = 0; caseColorNdx < DE_LENGTH_OF_ARRAY(caseColors); caseColorNdx++)
			{
				const DitheringCase::PatternType	patternType		= (DitheringCase::PatternType)patternTypeI;
				const string						caseName		= string("") + DitheringCase::getPatternTypeName(patternType) + "_" + caseColors[caseColorNdx].name;

				group->addChild(new DitheringCase(m_context.getTestContext(), m_context.getRenderContext(), caseName.c_str(), "", ditheringEnabled, patternType, caseColors[caseColorNdx].color));
			}
		}
	}
}